

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError ContinuePoll(PaAlsaStream *stream,StreamDirection streamDir,int *pollTimeout,
                    int *continuePoll)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long in_RAX;
  ulong uVar4;
  long lVar5;
  pthread_t __thread1;
  char *errorText;
  int __pa_unsure_error_id;
  double dVar6;
  undefined1 auVar7 [16];
  snd_pcm_sframes_t delay;
  long local_38;
  
  *continuePoll = 1;
  local_38 = in_RAX;
  iVar2 = snd_pcm_delay((&stream->capture)[streamDir == StreamDirection_In].pcm,&local_38);
  if (iVar2 < 0) {
    if (iVar2 != -0x20) {
      __thread1 = pthread_self();
      iVar3 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar3 != 0) {
        errorText = (char *)snd_strerror(iVar2);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,errorText);
      }
      PaUtil_DebugPrint(
                       "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3350\n"
                       );
      return -9999;
    }
  }
  else {
    if (streamDir == StreamDirection_Out) {
      local_38 = (stream->capture).alsaBufferSize - local_38;
    }
    uVar1 = (&stream->capture)[streamDir == StreamDirection_In].framesPerPeriod;
    uVar4 = local_38 - (uVar1 >> 1);
    if (-1 < (long)uVar4) {
      if (uVar1 <= uVar4) {
        return 0;
      }
      dVar6 = (stream->streamRepresentation).streamInfo.sampleRate;
      if (0.0 < dVar6) {
        lVar5 = uVar4 * 1000;
        auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar7._0_8_ = lVar5;
        auVar7._12_4_ = 0x45300000;
        dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / dVar6);
        *pollTimeout = (int)dVar6;
        return 0;
      }
      __assert_fail("stream->streamRepresentation.streamInfo.sampleRate > 0.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x8a7,"int CalculatePollTimeout(const PaAlsaStream *, unsigned long)");
    }
  }
  *continuePoll = 0;
  return 0;
}

Assistant:

static PaError ContinuePoll( const PaAlsaStream *stream, StreamDirection streamDir, int *pollTimeout, int *continuePoll )
{
    PaError result = paNoError;
    snd_pcm_sframes_t delay, margin;
    int err;
    const PaAlsaStreamComponent *component = NULL, *otherComponent = NULL;

    *continuePoll = 1;

    if( StreamDirection_In == streamDir )
    {
        component = &stream->capture;
        otherComponent = &stream->playback;
    }
    else
    {
        component = &stream->playback;
        otherComponent = &stream->capture;
    }

    /* ALSA docs say that negative delay should indicate xrun, but in my experience alsa_snd_pcm_delay returns -EPIPE */
    if( ( err = alsa_snd_pcm_delay( otherComponent->pcm, &delay ) ) < 0 )
    {
        if( err == -EPIPE )
        {
            /* Xrun */
            *continuePoll = 0;
            goto error;
        }

        ENSURE_( err, paUnanticipatedHostError );
    }

    if( StreamDirection_Out == streamDir )
    {
        /* Number of eligible frames before capture overrun */
        delay = otherComponent->alsaBufferSize - delay;
    }
    margin = delay - otherComponent->framesPerPeriod / 2;

    if( margin < 0 )
    {
        PA_DEBUG(( "%s: Stopping poll for %s\n", __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback" ));
        *continuePoll = 0;
    }
    else if( margin < otherComponent->framesPerPeriod )
    {
        *pollTimeout = CalculatePollTimeout( stream, margin );
        PA_DEBUG(( "%s: Trying to poll again for %s frames, pollTimeout: %d\n",
                    __FUNCTION__, StreamDirection_In == streamDir ? "capture" : "playback", *pollTimeout ));
    }

error:
    return result;
}